

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_test.cc
# Opt level: O2

void __thiscall ArrayTest_Resize_Test::~ArrayTest_Resize_Test(ArrayTest_Resize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArrayTest, Resize) {
  upb::Arena arena;
  upb::Status status;

  upb_Array* array = upb_Array_New(arena.ptr(), kUpb_CType_Int32);
  EXPECT_TRUE(array);

  for (int i = 0; i < 10; i++) {
    upb_MessageValue mv;
    mv.int32_val = 3 * i;

    upb_Array_Append(array, mv, arena.ptr());
    EXPECT_EQ(upb_Array_Size(array), i + 1);
    EXPECT_EQ(upb_Array_Get(array, i).int32_val, 3 * i);
  }

  upb_Array_Resize(array, 12, arena.ptr());
  EXPECT_EQ(upb_Array_Get(array, 10).int32_val, 0);
  EXPECT_EQ(upb_Array_Get(array, 11).int32_val, 0);

  upb_Array_Resize(array, 4, arena.ptr());
  EXPECT_EQ(upb_Array_Size(array), 4);

  upb_Array_Resize(array, 6, arena.ptr());
  EXPECT_EQ(upb_Array_Size(array), 6);

  EXPECT_EQ(upb_Array_Get(array, 3).int32_val, 9);
  EXPECT_EQ(upb_Array_Get(array, 4).int32_val, 0);
  EXPECT_EQ(upb_Array_Get(array, 5).int32_val, 0);
}